

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O3

void pdf_dict_vputl(hd_context *ctx,pdf_obj *obj,pdf_obj *val,__va_list_tag *keys)

{
  uint uVar1;
  pdf_document *doc;
  pdf_obj *ppVar2;
  pdf_obj *obj_00;
  char *pcVar3;
  long *plVar4;
  pdf_obj *key;
  pdf_obj *obj_01;
  pdf_obj *key_00;
  
  if (((pdf_obj *)0x188 < obj) && (obj->kind == 'r')) {
    obj = pdf_resolve_indirect_chain(ctx,obj);
  }
  if ((obj < (pdf_obj *)0x189) || (obj->kind != 'd')) {
    pcVar3 = pdf_objkindstr(obj);
    hd_throw(ctx,2,"not a dict (%s)",pcVar3);
  }
  doc = *(pdf_document **)(obj + 2);
  uVar1 = keys->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    plVar4 = (long *)((ulong)uVar1 + (long)keys->reg_save_area);
    keys->gp_offset = uVar1 + 8;
  }
  else {
    plVar4 = (long *)keys->overflow_arg_area;
    keys->overflow_arg_area = plVar4 + 1;
  }
  ppVar2 = (pdf_obj *)*plVar4;
  if ((pdf_obj *)*plVar4 == (pdf_obj *)0x0) {
    return;
  }
  do {
    key = ppVar2;
    obj_00 = obj;
    uVar1 = keys->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar4 = (long *)((ulong)uVar1 + (long)keys->reg_save_area);
      keys->gp_offset = uVar1 + 8;
    }
    else {
      plVar4 = (long *)keys->overflow_arg_area;
      keys->overflow_arg_area = plVar4 + 1;
    }
    ppVar2 = (pdf_obj *)*plVar4;
    if (ppVar2 == (pdf_obj *)0x0) goto LAB_0010df23;
    obj = pdf_dict_get(ctx,obj_00,key);
    obj_01 = obj_00;
    key_00 = key;
  } while (obj != (pdf_obj *)0x0);
  do {
    key = ppVar2;
    obj_00 = pdf_new_dict(ctx,doc,1);
    pdf_dict_put_drop(ctx,obj_01,key_00,obj_00);
    uVar1 = keys->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar4 = (long *)((ulong)uVar1 + (long)keys->reg_save_area);
      keys->gp_offset = uVar1 + 8;
    }
    else {
      plVar4 = (long *)keys->overflow_arg_area;
      keys->overflow_arg_area = plVar4 + 1;
    }
    ppVar2 = (pdf_obj *)*plVar4;
    obj_01 = obj_00;
    key_00 = key;
  } while ((pdf_obj *)*plVar4 != (pdf_obj *)0x0);
LAB_0010df23:
  pdf_dict_get_put(ctx,obj_00,key,val,(pdf_obj **)0x0);
  return;
}

Assistant:

static void
pdf_dict_vputl(hd_context *ctx, pdf_obj *obj, pdf_obj *val, va_list keys)
{
    pdf_obj *key;
    pdf_obj *next_key;
    pdf_obj *next_obj;
    pdf_document *doc;

    RESOLVE(obj);
    if (!OBJ_IS_DICT(obj))
        hd_throw(ctx, HD_ERROR_GENERIC, "not a dict (%s)", pdf_objkindstr(obj));

    doc = DICT(obj)->doc;

    key = va_arg(keys, pdf_obj *);
    if (key == NULL)
        return;

    while ((next_key = va_arg(keys, pdf_obj *)) != NULL)
    {
        next_obj = pdf_dict_get(ctx, obj, key);
        if (next_obj == NULL)
            goto new_obj;
        obj = next_obj;
        key = next_key;
    }

    pdf_dict_put(ctx, obj, key, val);
    return;

    new_obj:
    /* We have to create entries */
    do
    {
        next_obj = pdf_new_dict(ctx, doc, 1);
        pdf_dict_put_drop(ctx, obj, key, next_obj);
        obj = next_obj;
        key = next_key;
    }
    while ((next_key = va_arg(keys, pdf_obj *)) != NULL);

    pdf_dict_put(ctx, obj, key, val);
    return;
}